

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator,_bool>
* __thiscall
google::protobuf::Map<std::__cxx11::string,int>::
TryEmplaceInternal<std::__cxx11::string_const&,int_const&>
          (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator,_bool>
           *__return_storage_ptr__,Map<std::__cxx11::string,int> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,int *args)

{
  bool bVar1;
  uint64_t uVar2;
  NodeBase *node;
  uint64_t v;
  map_index_t b;
  ulong uVar3;
  long lVar4;
  ViewType k_00;
  NodeAndBucket NVar5;
  
  k_00._M_str = (k->_M_dataplus)._M_p;
  k_00._M_len = k->_M_string_length;
  NVar5 = protobuf::internal::
          KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::FindHelper((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this,k_00);
  node = NVar5.node;
  b = NVar5.bucket;
  if (node == (NodeBase *)0x0) {
    bVar1 = protobuf::internal::
            KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::ResizeIfLoadIsOutOfRange
                      ((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this,(ulong)(*(int *)this + 1));
    if (bVar1) {
      uVar3 = k->_M_string_length;
      uVar2 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                        (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,
                         (k->_M_dataplus)._M_p,uVar3);
      uVar3 = (uVar2 ^ uVar3) * -0x234dd359734ecb13;
      uVar3 = ((uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 |
               uVar3 << 0x38) ^ *(ulong *)(this + 0x10)) * -0x234dd359734ecb13;
      lVar4 = ((uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 |
               uVar3 << 0x38) ^ *(ulong *)(this + 0x10)) * -0x234dd359734ecb13;
      b = ((uint)(byte)((ulong)lVar4 >> 0x38) | ((uint)((ulong)lVar4 >> 0x20) & 0xff0000) >> 8 |
           (uint)((ulong)lVar4 >> 0x18) & 0xff0000 | (uint)((ulong)lVar4 >> 8) & 0xff000000) &
          *(int *)(this + 4) - 1U;
    }
    node = protobuf::internal::UntypedMapBase::AllocNode((UntypedMapBase *)this,0x30);
    Arena::CreateInArenaStorage<std::__cxx11::string,std::__cxx11::string_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(node + 1),
               *(Arena **)(this + 0x18),k);
    *(int *)&node[5].next = *args;
    protobuf::internal::
    KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    InsertUnique((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this,b,(KeyNode *)node);
    *(int *)this = *(int *)this + 1;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  (__return_storage_ptr__->first).super_UntypedMapIterator.node_ = node;
  (__return_storage_ptr__->first).super_UntypedMapIterator.m_ = (UntypedMapBase *)this;
  (__return_storage_ptr__->first).super_UntypedMapIterator.bucket_index_ = b;
  __return_storage_ptr__->second = bVar1;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> TryEmplaceInternal(K&& k, Args&&... args) {
    auto p = this->FindHelper(TS::ToView(k));
    internal::map_index_t b = p.bucket;
    // Case 1: key was already present.
    if (p.node != nullptr) {
      return std::make_pair(iterator(internal::UntypedMapIterator{
                                static_cast<Node*>(p.node), this, p.bucket}),
                            false);
    }
    // Case 2: insert.
    if (this->ResizeIfLoadIsOutOfRange(this->num_elements_ + 1)) {
      b = this->BucketNumber(TS::ToView(k));
    }
    auto* node = CreateNode(std::forward<K>(k), std::forward<Args>(args)...);
    this->InsertUnique(b, node);
    ++this->num_elements_;
    return std::make_pair(iterator(internal::UntypedMapIterator{node, this, b}),
                          true);
  }